

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O3

void on_underlying_amqp_management_error(void *context)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  int iVar1;
  char *pcVar2;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar2 = "on_underlying_amqp_management_error called with NULL context";
    iVar1 = 0x9d;
  }
  else {
    iVar1 = *(int *)((long)context + 8);
    if (iVar1 == 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar2 = "Unexpected AMQP error in CLOSED state";
      iVar1 = 0xaa;
    }
    else {
      if (iVar1 == 1) {
        *(undefined4 *)((long)context + 8) = 0;
        amqp_management_close(*context);
        (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),2);
        return;
      }
      if (iVar1 == 2) {
        *(undefined4 *)((long)context + 8) = 3;
        (**(code **)((long)context + 0x20))(*(undefined8 *)((long)context + 0x28));
        return;
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar2 = "AMQP management error in unknown state";
      iVar1 = 0xa6;
    }
  }
  (*UNRECOVERED_JUMPTABLE)
            (AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
             "on_underlying_amqp_management_error",iVar1,1,pcVar2);
  return;
}

Assistant:

static void on_underlying_amqp_management_error(void* context)
{
    if (context == NULL)
    {
        /* Codes_SRS_CBS_01_110: [ When `on_amqp_management_error` is called with NULL `context`, it shall do nothing. ]*/
        LogError("on_underlying_amqp_management_error called with NULL context");
    }
    else
    {
        CBS_HANDLE cbs = (CBS_HANDLE)context;

        switch (cbs->cbs_state)
        {
        default:
            LogError("AMQP management error in unknown state");
            break;

        case CBS_STATE_CLOSED:
            LogError("Unexpected AMQP error in CLOSED state");
            break;

        case CBS_STATE_OPENING:
            cbs->cbs_state = CBS_STATE_CLOSED;
            /* Codes_SRS_CBS_01_114: [ Additionally the underlying AMQP management shall be closed by calling `amqp_management_close`. ]*/
            (void)amqp_management_close(cbs->amqp_management);
            /* Codes_SRS_CBS_01_111: [ If CBS is OPENING the callback `on_cbs_open_complete` shall be called with `CBS_OPEN_ERROR` and the `on_cbs_open_complete_context` shall be passed as argument. ]*/
            cbs->on_cbs_open_complete(cbs->on_cbs_open_complete_context, CBS_OPEN_ERROR);
            break;

        case CBS_STATE_OPEN:
            /* Codes_SRS_CBS_01_112: [ If CBS is OPEN the callback `on_cbs_error` shall be called and the `on_cbs_error_context` shall be passed as argument. ]*/
            cbs->cbs_state = CBS_STATE_ERROR;
            cbs->on_cbs_error(cbs->on_cbs_error_context);
            break;
        }
    }
}